

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
local_vehicles(vector<int,_std::allocator<int>_> *__return_storage_ptr__,int x,int y,
              vector<vehicle,_std::allocator<vehicle>_> *vehicles,int same)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  int ydiff;
  int xdiff;
  int i;
  vector<vehicle,_std::allocator<vehicle>_> *pvStack_20;
  int same_local;
  vector<vehicle,_std::allocator<vehicle>_> *vehicles_local;
  int y_local;
  int x_local;
  vector<int,_std::allocator<int>_> *local;
  
  xdiff._3_1_ = 0;
  i = same;
  pvStack_20 = vehicles;
  vehicles_local._0_4_ = y;
  vehicles_local._4_4_ = x;
  _y_local = __return_storage_ptr__;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  for (ydiff = 0; ydiff < 0x19; ydiff = ydiff + 1) {
    if (ydiff != i) {
      pvVar3 = std::vector<vehicle,_std::allocator<vehicle>_>::operator[](vehicles,(long)ydiff);
      iVar1 = pvVar3->x - vehicles_local._4_4_;
      pvVar3 = std::vector<vehicle,_std::allocator<vehicle>_>::operator[](vehicles,(long)ydiff);
      iVar2 = pvVar3->y - (int)vehicles_local;
      if (iVar1 * iVar1 + iVar2 * iVar2 < 0x1440) {
        std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&ydiff);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<int> local_vehicles(int x, int y, vector<vehicle> vehicles, int same){
	vector<int> local;
	
	for (int i=0;i<numVehicles;i++){
		if (i != same){
			int xdiff = vehicles[i].x-x;
			int ydiff = vehicles[i].y-y;

			if (xdiff*xdiff + ydiff*ydiff <threshold*threshold){
				local.push_back(i);
			}
		}
	}
	return local;
}